

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ess_describe_scaling_activities.cc
# Opt level: O0

void anon_unknown.dwarf_37b25::Json2Type
               (Value *value,EssDescribeScalingActivitiesResponseType *item)

{
  bool bVar1;
  Int IVar2;
  Value *pVVar3;
  Json2Array<aliyun::EssDescribeScalingActivitiesScalingActivityType> local_19;
  EssDescribeScalingActivitiesResponseType *local_18;
  EssDescribeScalingActivitiesResponseType *item_local;
  Value *value_local;
  
  local_18 = item;
  item_local = (EssDescribeScalingActivitiesResponseType *)value;
  bVar1 = Json::Value::isMember(value,"TotalCount");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"TotalCount");
    IVar2 = Json::Value::asInt(pVVar3);
    local_18->total_count = IVar2;
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"PageNumber");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"PageNumber");
    IVar2 = Json::Value::asInt(pVVar3);
    local_18->page_number = IVar2;
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"PageSize");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"PageSize");
    IVar2 = Json::Value::asInt(pVVar3);
    local_18->page_size = IVar2;
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"ScalingActivities");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"ScalingActivities");
    bVar1 = Json::Value::isMember(pVVar3,"ScalingActivity");
    if (bVar1) {
      pVVar3 = Json::Value::operator[]((Value *)item_local,"ScalingActivities");
      pVVar3 = Json::Value::operator[](pVVar3,"ScalingActivity");
      Json2Array<aliyun::EssDescribeScalingActivitiesScalingActivityType>::Json2Array
                (&local_19,pVVar3,&local_18->scaling_activities);
    }
  }
  return;
}

Assistant:

void Json2Type(const Json::Value& value, EssDescribeScalingActivitiesResponseType* item) {
  if(value.isMember("TotalCount")) {
    item->total_count = value["TotalCount"].asInt();
  }
  if(value.isMember("PageNumber")) {
    item->page_number = value["PageNumber"].asInt();
  }
  if(value.isMember("PageSize")) {
    item->page_size = value["PageSize"].asInt();
  }
  if(value.isMember("ScalingActivities") && value["ScalingActivities"].isMember("ScalingActivity")) {
    Json2Array<EssDescribeScalingActivitiesScalingActivityType>(value["ScalingActivities"]["ScalingActivity"], &item->scaling_activities);
  }
}